

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsFreewheel.cpp
# Opt level: O3

void __thiscall
chrono::ChShaftsFreewheel::IntLoadConstraint_C
          (ChShaftsFreewheel *this,uint off_L,ChVectorDynamic<> *Qc,double c,bool do_clamp,
          double recovery_clamp)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  undefined1 auVar4 [16];
  double dVar5;
  undefined1 auVar7 [16];
  undefined1 in_register_00001248 [56];
  undefined1 auVar8 [64];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar6 [16];
  
  auVar8._8_56_ = in_register_00001248;
  auVar8._0_8_ = recovery_clamp;
  dVar5 = ((this->super_ChShaftsCouple).shaft1)->pos - ((this->super_ChShaftsCouple).shaft2)->pos;
  if (this->free_forward == true) {
    auVar9._8_8_ = 0;
    auVar9._0_8_ = this->phase;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = this->step;
    auVar12._0_8_ = (this->alpha_max - this->phase) / this->step;
    auVar12._8_8_ = 0;
    auVar4 = vroundsd_avx(auVar12,auVar12,9);
    auVar4 = vfmadd213sd_fma(auVar4,auVar10,auVar9);
    dVar5 = (double)((ulong)!(bool)(this->jamming_mode & 1) * (long)(dVar5 - auVar4._0_8_)) * c;
    if (do_clamp) {
      auVar2._8_8_ = 0x8000000000000000;
      auVar2._0_8_ = 0x8000000000000000;
      auVar4 = vxorpd_avx512vl(auVar8._0_16_,auVar2);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = dVar5;
      auVar4 = vmaxsd_avx(auVar6,auVar4);
      dVar5 = auVar4._0_8_;
    }
  }
  else {
    auVar11._8_8_ = 0;
    auVar11._0_8_ = this->phase;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = this->step;
    auVar4._0_8_ = (this->phase - this->alpha_max) / this->step;
    auVar4._8_8_ = 0;
    auVar4 = vroundsd_avx(auVar4,auVar4,9);
    auVar4 = vfmsub213sd_fma(auVar4,auVar13,auVar11);
    dVar5 = (double)((ulong)!(bool)(this->jamming_mode & 1) * (long)-(-dVar5 - auVar4._0_8_)) * c;
    if (do_clamp) {
      auVar7._8_8_ = 0;
      auVar7._0_8_ = dVar5;
      auVar4 = vminsd_avx(auVar7,auVar8._0_16_);
      dVar5 = auVar4._0_8_;
    }
  }
  uVar3 = (ulong)off_L;
  if ((long)uVar3 <
      (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
    pdVar1 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    pdVar1[uVar3] = dVar5 + pdVar1[uVar3];
    return;
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
               );
}

Assistant:

void ChShaftsFreewheel::IntLoadConstraint_C(const unsigned int off_L,  // offset in Qc residual
                                       ChVectorDynamic<>& Qc,     // result: the Qc residual, Qc += c*C
                                       const double c,            // a scaling factor
                                       bool do_clamp,             // apply clamping to c*C?
                                       double recovery_clamp      // value for min/max clamping of c*C
                                       ) {

    double relrot =  this->shaft1->GetPos() - this->shaft2->GetPos();
    
    double res;

    if (this->free_forward)
        res = relrot - (this->phase + this->step * floor((alpha_max - this->phase) / this->step));
    else
        res = - (-relrot - (-this->phase + this->step * floor((-alpha_max + this->phase) / this->step)));

    if (jamming_mode) 
        res = 0;

    double cnstr_violation = c * res;

    if (do_clamp) {
        if (this->free_forward)
            cnstr_violation = ChMax(cnstr_violation, -recovery_clamp); 
        else
            cnstr_violation = ChMin(cnstr_violation,  recovery_clamp);
    }

    Qc(off_L) += cnstr_violation;
}